

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfwsound.c
# Opt level: O3

MMFWSoundEntryFormat MMFWSoundEntry_FormatForEntry(MMFW *mmfw,int i)

{
  MMFWSoundEntryFormat MVar1;
  char result;
  char local_19;
  
  fseek((FILE *)mmfw->fp,mmfw->kind_metadata_start_pos,0);
  MVar1 = MMFW_SOUND_MONO_S16BE_22050;
  fseek((FILE *)mmfw->fp,(ulong)mmfw->n_entries << 2,1);
  fseek((FILE *)mmfw->fp,2,1);
  fseek((FILE *)mmfw->fp,(long)i,1);
  ReadChar(mmfw->fp,1,&local_19);
  if (local_19 != '\x15') {
    if (local_19 == '\x1d') {
      MVar1 = MMFW_SOUND_MONO_S16BE_44100;
    }
    else {
      MVar1 = MMFW_SOUND_UNKNOWN;
      LPWarn("mmfw","unhandled MMFW Sound entry format %d for entry %d, setting to UNKNOWN",
             (ulong)(uint)(int)local_19,i);
    }
  }
  return MVar1;
}

Assistant:

MMFWSoundEntryFormat
MMFWSoundEntry_FormatForEntry(MMFW *mmfw, int i)
{
	fseek(mmfw->fp, mmfw->kind_metadata_start_pos, SEEK_SET);

	/* Skip over the "A" metadta. */
	fseek(mmfw->fp, mmfw->n_entries*sizeof(uint32_t), SEEK_CUR);

	/* I think we need this special flag. */
	//uint16_t flag;
	//ReadUint16(mmfw->fp, 1, &flag);
	fseek(mmfw->fp, 2L, SEEK_CUR);

	/* Navigate to the correct entry. */
	fseek(mmfw->fp, i*sizeof(unsigned char), SEEK_CUR);

	char result;
	ReadChar(mmfw->fp, 1, &result);

	switch (result) {
	case 0x15:
		return MMFW_SOUND_MONO_S16BE_22050;
		break;
	case 0x1D:
		return MMFW_SOUND_MONO_S16BE_44100;
		break;
	default:
		LPWarn(LP_SUBSYSTEM_MMFW, "unhandled MMFW Sound entry format %d for entry %d, setting to UNKNOWN", result, i);
		return MMFW_SOUND_UNKNOWN;
	}
}